

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fssimplewindow.cpp
# Opt level: O0

void FsPushOnPaintEvent(void)

{
  undefined4 local_48 [2];
  XExposeEvent evt;
  
  local_48[0] = 0xc;
  evt.type = 0;
  evt._4_4_ = 0;
  evt.serial._0_4_ = 1;
  evt._16_8_ = ysXDsp;
  evt.display = (Display *)ysXWnd;
  evt.window._0_4_ = 0;
  evt.window._4_4_ = 0;
  evt.x = ysXWid;
  evt.y = ysXHei;
  evt.width = 0;
  XSendEvent(ysXDsp,ysXWnd,1,0x8000,local_48);
  return;
}

Assistant:

void FsPushOnPaintEvent(void)
{
	XExposeEvent evt;
	evt.type=Expose;
	evt.serial=0;
	evt.send_event=true;
	evt.display=ysXDsp;
	evt.window=ysXWnd;
	evt.x=0;
	evt.y=0;
	evt.width=ysXWid;
	evt.height=ysXHei;
	evt.count=0;
	XSendEvent(ysXDsp,ysXWnd,true,ExposureMask,(XEvent *)&evt);
}